

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall slang::ast::Type::implements(Type *this,Type *ifaceClass)

{
  Symbol *pSVar1;
  Scope *pSVar2;
  bool bVar3;
  Type *this_00;
  long lVar4;
  bool bVar5;
  
  this_00 = this->canonical;
  if (this_00 == (Type *)0x0) {
    this->canonical = this;
    this_00 = this;
    do {
      this_00 = DeclaredType::getType((DeclaredType *)(this_00 + 1));
      this->canonical = this_00;
    } while ((this_00->super_Symbol).kind == TypeAlias);
  }
  bVar3 = isClass(this_00);
  if (bVar3) {
    if (*(int *)&this_00[1].super_Symbol.nextInScope != 0) {
      Scope::elaborate((Scope *)(this_00 + 1));
    }
    pSVar1 = this_00[2].super_Symbol.nextInScope;
    if (pSVar1 != (Symbol *)0x0) {
      pSVar2 = this_00[2].super_Symbol.parentScope;
      lVar4 = 0;
      do {
        bVar3 = isMatching(*(Type **)((long)&pSVar2->compilation + lVar4),ifaceClass);
        if (bVar3) {
          return bVar3;
        }
        bVar5 = (long)pSVar1 * 8 + -8 != lVar4;
        lVar4 = lVar4 + 8;
      } while (bVar5);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Type::implements(const Type& ifaceClass) const {
    const Type* c = &getCanonicalType();
    if (!c->isClass())
        return false;

    for (auto iface : c->as<ClassType>().getImplementedInterfaces()) {
        if (iface->isMatching(ifaceClass))
            return true;
    }

    return false;
}